

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void __thiscall
pbrt::KdTreeNode::InitLeaf
          (KdTreeNode *this,span<const_int> primNums,
          vector<int,_std::allocator<int>_> *primitiveIndices)

{
  size_t sVar1;
  int *piVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *in_RCX;
  int *in_RDI;
  int pn;
  iterator __end3;
  iterator __begin3;
  span<const_int> *__range3;
  span<const_int> local_10;
  
  sVar1 = pstd::span<const_int>::size(&local_10);
  in_RDI[1] = (uint)(sVar1 << 2) | 3;
  sVar1 = pstd::span<const_int>::size(&local_10);
  if (sVar1 == 0) {
    *in_RDI = 0;
  }
  else {
    sVar1 = pstd::span<const_int>::size(&local_10);
    if (sVar1 == 1) {
      piVar2 = pstd::span<const_int>::operator[](&local_10,0);
      *in_RDI = *piVar2;
    }
    else {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
      *in_RDI = (int)sVar3;
      this_00 = (vector<int,_std::allocator<int>_> *)pstd::span<const_int>::begin(&local_10);
      __x = (vector<int,_std::allocator<int>_> *)pstd::span<const_int>::end(&local_10);
      for (; this_00 != __x;
          this_00 = (vector<int,_std::allocator<int>_> *)
                    ((long)&(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + 4)) {
        std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict3 *)__x);
      }
    }
  }
  return;
}

Assistant:

void KdTreeNode::InitLeaf(pstd::span<const int> primNums,
                          std::vector<int> *primitiveIndices) {
    flags = 3 | (primNums.size() << 2);
    // Store primitive ids for leaf node
    if (primNums.size() == 0)
        onePrimitiveIndex = 0;
    else if (primNums.size() == 1)
        onePrimitiveIndex = primNums[0];
    else {
        primitiveIndicesOffset = primitiveIndices->size();
        for (int pn : primNums)
            primitiveIndices->push_back(pn);
    }
}